

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O3

bool __thiscall
ser::Serializer::RegisterField
          (Serializer *this,string *name,string *type,int bytesPerElement,int iSize,int jSize,
          int kSize,int lSize,int iMinusHalo,int iPlusHalo,int jMinusHalo,int jPlusHalo,
          int kMinusHalo,int kPlusHalo,int lMinusHalo,int lPlusHalo)

{
  pointer pcVar1;
  size_t __n;
  int iVar2;
  DataFieldInfo *other_00;
  ostream *poVar3;
  SerializationException *pSVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  DataFieldInfo info;
  DataFieldInfo other;
  SerializationException exception_1;
  ostringstream errorstr;
  undefined1 *local_380 [2];
  undefined1 local_370 [16];
  undefined1 *local_360 [2];
  undefined1 local_350 [16];
  undefined1 local_340 [8];
  _Alloc_hider local_338;
  undefined1 local_330 [16];
  string local_320 [16];
  char local_310 [16];
  int local_300;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  local_2c8;
  undefined1 *local_298;
  undefined1 local_288 [16];
  DataFieldInfo local_278;
  undefined **local_1d0;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  ostringstream local_1a8 [376];
  
  if ((((iSize < 1) || (jSize < 1)) || (kSize < 1)) || (lSize < 1)) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error: field ",0xd);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," is registered with sizes: ",0x1b);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iSize);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"x",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,jSize);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"x",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,kSize);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"x",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,lSize);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"Sizes must be larger than 0 for all dimensions\n",0x2f);
    local_338._M_p = local_330 + 8;
    local_340 = (undefined1  [8])&PTR__SerializationException_0018ea30;
    local_330._0_8_ = 0;
    local_330[8] = '\0';
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_assign((string *)&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.name_._M_dataplus._M_p != &local_278.name_.field_2) {
      operator_delete(local_278.name_._M_dataplus._M_p);
    }
    pSVar4 = (SerializationException *)__cxa_allocate_exception(0x28);
    SerializationException::SerializationException(pSVar4,(SerializationException *)local_340);
    __cxa_throw(pSVar4,&SerializationException::typeinfo,
                SerializationException::~SerializationException);
  }
  DataFieldInfo::DataFieldInfo((DataFieldInfo *)local_340);
  local_360[0] = local_350;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_360,pcVar1,pcVar1 + name->_M_string_length);
  local_380[0] = local_370;
  pcVar1 = (type->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_380,pcVar1,pcVar1 + type->_M_string_length);
  std::__cxx11::string::_M_assign((string *)local_340);
  std::__cxx11::string::_M_assign(local_320);
  local_2fc = (uint)(lSize != 1) + (uint)(kSize != 1) + (uint)(jSize != 1) + (uint)(iSize != 1);
  local_2f0 = kSize;
  local_2ec = lSize;
  local_2e4 = iMinusHalo;
  local_2e8 = iPlusHalo;
  local_2dc = jMinusHalo;
  local_2e0 = jPlusHalo;
  local_2d4 = kMinusHalo;
  local_2d8 = kPlusHalo;
  local_2cc = lMinusHalo;
  local_2d0 = lPlusHalo;
  local_300 = bytesPerElement;
  local_2f8 = iSize;
  local_2f4 = jSize;
  if (local_380[0] != local_370) {
    operator_delete(local_380[0]);
  }
  if (local_360[0] != local_350) {
    operator_delete(local_360[0]);
  }
  DataFieldInfo::DataFieldInfo(&local_278);
  other_00 = FieldsTable::Find(&this->fieldsTable_,name);
  DataFieldInfo::operator=(&local_278,other_00);
  __n = type->_M_string_length;
  if (__n == local_278.type_._M_string_length) {
    if (__n != 0) {
      iVar2 = bcmp((type->_M_dataplus)._M_p,local_278.type_._M_dataplus._M_p,__n);
      if (iVar2 != 0) goto LAB_0016203e;
    }
    if (local_278.bytesPerElement_ == bytesPerElement) {
      auVar5._0_4_ = -(uint)(iSize == local_278.iSize_);
      auVar5._4_4_ = -(uint)(jSize == local_278.jSize_);
      auVar5._8_4_ = -(uint)(kSize == local_278.kSize_);
      auVar5._12_4_ = -(uint)(lSize == local_278.lSize_);
      auVar6._0_4_ = -(uint)(iPlusHalo == local_278.iPlusHalo_);
      auVar6._4_4_ = -(uint)(iMinusHalo == local_278.iMinusHalo_);
      auVar6._8_4_ = -(uint)(jPlusHalo == local_278.jPlusHalo_);
      auVar6._12_4_ = -(uint)(jMinusHalo == local_278.jMinusHalo_);
      auVar6 = packssdw(auVar5,auVar6);
      auVar6 = packsswb(auVar6,auVar6);
      if ((((byte)(SUB161(auVar6 >> 7,0) & 1 | (SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar6 >> 0x17,0) & 1) << 2 | (SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar6 >> 0x27,0) & 1) << 4 | (SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar6 >> 0x37,0) & 1) << 6 | SUB161(auVar6 >> 0x3f,0) << 7) == 0xff) &&
          (local_278.kMinusHalo_ == kMinusHalo)) &&
         ((local_278.kPlusHalo_ == kPlusHalo &&
          ((local_278.lMinusHalo_ == lMinusHalo && (local_278.lPlusHalo_ == lPlusHalo)))))) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                     *)&local_278.metainfo_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278.type_._M_dataplus._M_p != &local_278.type_.field_2) {
          operator_delete(local_278.type_._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278.name_._M_dataplus._M_p != &local_278.name_.field_2) {
          operator_delete(local_278.name_._M_dataplus._M_p);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
        ::~_Rb_tree(&local_2c8);
        if ((char *)local_320._0_8_ != local_310) {
          operator_delete((void *)local_320._0_8_);
        }
        if (local_340 != (undefined1  [8])local_330) {
          operator_delete((void *)local_340);
        }
        return false;
      }
    }
  }
LAB_0016203e:
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error: field ",0xd);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," was already registered into ",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"serializer with different information",0x25);
  local_1c8._M_p = (pointer)&local_1b8;
  local_1d0 = &PTR__SerializationException_0018ea30;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&local_1c8);
  if (local_298 != local_288) {
    operator_delete(local_298);
  }
  pSVar4 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(pSVar4,(SerializationException *)&local_1d0);
  __cxa_throw(pSVar4,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

bool Serializer::RegisterField(const std::string& name, std::string type, int bytesPerElement,
            int iSize, int jSize, int kSize, int lSize,
            int iMinusHalo, int iPlusHalo, int jMinusHalo, int jPlusHalo,
            int kMinusHalo, int kPlusHalo, int lMinusHalo, int lPlusHalo
        )
{
    // Check that sizes are >= 1
    if (iSize < 1 || jSize < 1 || kSize < 1 || lSize < 1)
    {
        std::ostringstream errorstr;
        errorstr << "Error: field " << name << " is registered with sizes: "
            << iSize << "x" << jSize << "x" << kSize << "x" << lSize << "\n"
            << "Sizes must be larger than 0 for all dimensions\n";
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }

    // Compute rank
    int rank = (iSize != 1 ? 1: 0) + (jSize != 1 ? 1: 0)
             + (kSize != 1 ? 1: 0) + (lSize != 1 ? 1: 0);

    // Create info object
    DataFieldInfo info;
    info.Init(name, type, bytesPerElement, rank,
              iSize, jSize, kSize, lSize,
              iMinusHalo, iPlusHalo, jMinusHalo, jPlusHalo,
              kMinusHalo, kPlusHalo, lMinusHalo, lPlusHalo);

    DataFieldInfo other;
    try
    {
        other = fieldsTable_.Find(name);
    }
    catch (SerializationException&)
    {
        // Field does not exist: register and exit
        fieldsTable_.RegisterField(info);
        return true;
    }

    // Field was alredy registered: check info
    if (   type != other.type()
        || bytesPerElement != other.bytesPerElement()
        || iSize != other.iSize()
        || jSize != other.jSize()
        || kSize != other.kSize()
        || lSize != other.lSize()
        || iMinusHalo != other.iMinusHaloSize()
        || iPlusHalo  != other.iPlusHaloSize()
        || jMinusHalo != other.jMinusHaloSize()
        || jPlusHalo  != other.jPlusHaloSize()
        || kMinusHalo != other.kMinusHaloSize()
        || kPlusHalo  != other.kPlusHaloSize()
        || lMinusHalo != other.lMinusHaloSize()
        || lPlusHalo  != other.lPlusHaloSize()
       )
    {
        std::ostringstream errorstr;
        errorstr << "Error: field " << name << " was already registered into "
            << "serializer with different information";
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }

    return false;
}